

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O0

void __thiscall
HFactor::btranU(HFactor *this,HVector *rhs,double expected_density,
               HighsTimerClock *factor_timer_clock_pointer)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  size_type sVar8;
  const_reference pvVar9;
  const_reference pvVar10;
  HVector *in_RDX;
  long in_RSI;
  int iVar11;
  long in_RDI;
  double in_XMM0_Qa;
  HighsInt *h_index;
  HighsInt k;
  HighsInt end;
  HighsInt start;
  double pivot_multiplier;
  HighsInt pivotRow;
  HighsInt i_logic;
  HighsInt u_pivot_count;
  HighsInt rhs_count;
  double *ur_value;
  HighsInt *ur_index;
  HighsInt *ur_end;
  HighsInt *ur_start;
  HighsInt *rhs_index;
  double *rhs_array;
  double rhs_synthetic_tick;
  bool sparse_solve;
  double current_density;
  FactorTimer factor_timer;
  HighsTimerClock *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  HighsInt factor_clock;
  HighsInt HVar12;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  HVectorBase<double> *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  HVector *in_stack_ffffffffffffff78;
  double dVar13;
  undefined4 in_stack_ffffffffffffff80;
  int iVar14;
  undefined4 in_stack_ffffffffffffff84;
  int iVar15;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  HFactor *in_stack_ffffffffffffff90;
  HighsInt *in_stack_ffffffffffffff98;
  HighsInt *in_stack_ffffffffffffffa0;
  double *in_stack_ffffffffffffffa8;
  HighsInt *in_stack_ffffffffffffffb0;
  HighsInt *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  double dVar16;
  double *in_stack_ffffffffffffffd8;
  
  HVar12 = (HighsInt)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                     (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20),in_stack_ffffffffffffff10)
  ;
  if (*(int *)(in_RDI + 0x198) == 2) {
    FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20),
                       in_stack_ffffffffffffff10);
    btranPF((HFactor *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
            in_stack_ffffffffffffff78);
    FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20),in_stack_ffffffffffffff10
                     );
  }
  h_index = (HighsInt *)((double)*(int *)(in_RSI + 4) * 1.0 * *(double *)(in_RDI + 0xd8));
  bVar2 = true;
  if ((-1 < *(int *)(in_RSI + 4)) && (bVar2 = true, (double)h_index <= 0.05)) {
    bVar2 = 0.15 < in_XMM0_Qa;
  }
  factor_clock = (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  if (bVar2) {
    FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       factor_clock,in_stack_ffffffffffffff10);
    dVar16 = 0.0;
    pdVar3 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x7cfda1);
    piVar4 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7cfdba);
    piVar5 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7cfdd3);
    piVar6 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7cfdec);
    piVar7 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x7cfe05);
    in_stack_ffffffffffffff90 =
         (HFactor *)
         std::vector<double,_std::allocator<double>_>::data
                   ((vector<double,_std::allocator<double>_> *)0x7cfe1e);
    in_stack_ffffffffffffff8c = 0;
    sVar8 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x540));
    in_stack_ffffffffffffff88 = (int)sVar8;
    for (iVar15 = 0; HVar12 = (HighsInt)((ulong)in_stack_ffffffffffffff18 >> 0x20),
        iVar15 < in_stack_ffffffffffffff88; iVar15 = iVar15 + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x540),(long)iVar15);
      if (*pvVar9 != -1) {
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x540),(long)iVar15);
        iVar14 = *pvVar9;
        dVar13 = pdVar3[iVar14];
        if (ABS(dVar13) <= 1e-14) {
          pdVar3[iVar14] = 0.0;
        }
        else {
          pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x558),
                               (long)iVar15);
          dVar1 = *pvVar10;
          iVar11 = in_stack_ffffffffffffff8c + 1;
          piVar4[in_stack_ffffffffffffff8c] = iVar14;
          pdVar3[iVar14] = dVar13 / dVar1;
          in_stack_ffffffffffffff74 = piVar5[iVar15];
          in_stack_ffffffffffffff70 = piVar6[iVar15];
          in_stack_ffffffffffffff6c = in_stack_ffffffffffffff74;
          if (*(int *)(in_RDI + 200) <= iVar15) {
            dVar16 = (double)(in_stack_ffffffffffffff70 - in_stack_ffffffffffffff74) + dVar16;
          }
          for (; in_stack_ffffffffffffff8c = iVar11,
              in_stack_ffffffffffffff6c < in_stack_ffffffffffffff70;
              in_stack_ffffffffffffff6c = in_stack_ffffffffffffff6c + 1) {
            pdVar3[piVar7[in_stack_ffffffffffffff6c]] =
                 -(dVar13 / dVar1) *
                 (&in_stack_ffffffffffffff90->build_realTick)[in_stack_ffffffffffffff6c] +
                 pdVar3[piVar7[in_stack_ffffffffffffff6c]];
          }
        }
      }
    }
    *(int *)(in_RSI + 4) = in_stack_ffffffffffffff8c;
    *(double *)(in_RSI + 0x38) =
         dVar16 * 15.0 + (double)((in_stack_ffffffffffffff88 - *(int *)(in_RDI + 200)) * 10) +
         *(double *)(in_RSI + 0x38);
    FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      HVar12,in_stack_ffffffffffffff10);
  }
  else {
    FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       factor_clock,in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff24 = *(undefined4 *)(in_RDI + 200);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7d00e3);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7d00f9);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x7d010f);
    in_stack_ffffffffffffff40 =
         (HVectorBase<double> *)
         std::vector<int,_std::allocator<int>_>::operator[]
                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5d8),0);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x7d013f);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x620),0);
    in_stack_ffffffffffffff10 =
         (HighsTimerClock *)
         std::vector<double,_std::allocator<double>_>::operator[]
                   ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x638),0);
    solveHyper(HVar12,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,h_index,in_stack_ffffffffffffffd8
               ,in_RDX);
    HVar12 = (HighsInt)((ulong)in_RSI >> 0x20);
    FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      HVar12,in_stack_ffffffffffffff10);
  }
  if (*(int *)(in_RDI + 0x198) == 1) {
    FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       HVar12,in_stack_ffffffffffffff10);
    HVectorBase<double>::tight(in_stack_ffffffffffffff40);
    HVectorBase<double>::pack
              ((HVectorBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
    ;
    btranFT(in_stack_ffffffffffffff90,
            (HVector *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    HVectorBase<double>::tight(in_stack_ffffffffffffff40);
    FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      HVar12,in_stack_ffffffffffffff10);
  }
  if (*(int *)(in_RDI + 0x198) == 3) {
    FactorTimer::start((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       HVar12,in_stack_ffffffffffffff10);
    HVectorBase<double>::tight(in_stack_ffffffffffffff40);
    HVectorBase<double>::pack
              ((HVectorBase<double> *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
    ;
    btranMPF((HFactor *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (HVector *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    HVectorBase<double>::tight(in_stack_ffffffffffffff40);
    FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                      HVar12,in_stack_ffffffffffffff10);
  }
  FactorTimer::stop((FactorTimer *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    HVar12,in_stack_ffffffffffffff10);
  return;
}

Assistant:

void HFactor::btranU(HVector& rhs, const double expected_density,
                     HighsTimerClock* factor_timer_clock_pointer) const {
  FactorTimer factor_timer;
  factor_timer.start(FactorBtranUpper, factor_timer_clock_pointer);
  if (update_method == kUpdateMethodPf) {
    assert(!(update_method == kUpdateMethodPf));
    factor_timer.start(FactorBtranUpperPF, factor_timer_clock_pointer);
    btranPF(rhs);
    factor_timer.stop(FactorBtranUpperPF, factor_timer_clock_pointer);
  }

  // The regular part
  //
  // Determine style of solve
  const double current_density = 1.0 * rhs.count * inv_num_row;
  const bool sparse_solve = rhs.count < 0 || current_density > kHyperCancel ||
                            expected_density > kHyperBtranU;
  if (sparse_solve) {
    factor_timer.start(FactorBtranUpperSps, factor_timer_clock_pointer);
    // Alias to non constant
    double rhs_synthetic_tick = 0;
    // Alias to RHS
    double* rhs_array = rhs.array.data();
    HighsInt* rhs_index = rhs.index.data();
    // Alias to factor U
    const HighsInt* ur_start = this->ur_start.data();
    const HighsInt* ur_end = this->ur_lastp.data();
    const HighsInt* ur_index = this->ur_index.data();
    const double* ur_value = this->ur_value.data();
    // Local accumulation of RHS count
    HighsInt rhs_count = 0;
    // Transform
    HighsInt u_pivot_count = u_pivot_index.size();
    for (HighsInt i_logic = 0; i_logic < u_pivot_count; i_logic++) {
      // Skip void
      if (u_pivot_index[i_logic] == -1) continue;
      // Normal part
      const HighsInt pivotRow = u_pivot_index[i_logic];
      double pivot_multiplier = rhs_array[pivotRow];
      if (fabs(pivot_multiplier) > kHighsTiny) {
        pivot_multiplier /= u_pivot_value[i_logic];
        rhs_index[rhs_count++] = pivotRow;
        rhs_array[pivotRow] = pivot_multiplier;
        const HighsInt start = ur_start[i_logic];
        const HighsInt end = ur_end[i_logic];
        if (i_logic >= num_row) {
          rhs_synthetic_tick += (end - start);
        }
        for (HighsInt k = start; k < end; k++)
          rhs_array[ur_index[k]] -= pivot_multiplier * ur_value[k];
      } else
        rhs_array[pivotRow] = 0;
    }
    // Save the count
    rhs.count = rhs_count;
    rhs.synthetic_tick +=
        rhs_synthetic_tick * 15 + (u_pivot_count - num_row) * 10;
    factor_timer.stop(FactorBtranUpperSps, factor_timer_clock_pointer);
  } else {
    factor_timer.start(FactorBtranUpperHyper, factor_timer_clock_pointer);
    solveHyper(num_row, u_pivot_lookup.data(), u_pivot_index.data(),
               u_pivot_value.data(), &ur_start[0], ur_lastp.data(),
               &ur_index[0], &ur_value[0], &rhs);
    factor_timer.stop(FactorBtranUpperHyper, factor_timer_clock_pointer);
  }

  // The update part
  assert(rhs.count >= 0);
  if (update_method == kUpdateMethodFt) {
    factor_timer.start(FactorBtranUpperFT, factor_timer_clock_pointer);
    rhs.tight();
    rhs.pack();
    btranFT(rhs);
    rhs.tight();
    factor_timer.stop(FactorBtranUpperFT, factor_timer_clock_pointer);
  }
  if (update_method == kUpdateMethodMpf) {
    assert(!(update_method == kUpdateMethodMpf));
    factor_timer.start(FactorBtranUpperMPF, factor_timer_clock_pointer);
    rhs.tight();
    rhs.pack();
    btranMPF(rhs);
    rhs.tight();
    factor_timer.stop(FactorBtranUpperMPF, factor_timer_clock_pointer);
  }
  factor_timer.stop(FactorBtranUpper, factor_timer_clock_pointer);
}